

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::FsNode> __thiscall
kj::anon_unknown_35::AppendableFileImpl::cloneFsNode(AppendableFileImpl *this)

{
  File *__fn;
  int in_ECX;
  void *__child_stack;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar1;
  Own<const_kj::File> local_38;
  Own<kj::(anonymous_namespace)::AppendableFileImpl> local_28;
  AppendableFileImpl *this_local;
  
  this_local = this;
  __fn = Own<const_kj::File>::operator->((Own<const_kj::File> *)(in_RSI + 0x10));
  File::clone((File *)&local_38,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::AppendableFileImpl,kj::Own<kj::File_const>>
            ((kj *)&local_28,&local_38);
  Own<kj::FsNode_const>::Own<kj::(anonymous_namespace)::AppendableFileImpl,void>
            ((Own<kj::FsNode_const> *)this,&local_28);
  Own<kj::(anonymous_namespace)::AppendableFileImpl>::~Own(&local_28);
  Own<const_kj::File>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<const FsNode> cloneFsNode() const override {
    return heap<AppendableFileImpl>(file->clone());
  }